

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O1

void __thiscall QWidgetLineControl::moveCursor(QWidgetLineControl *this,int pos,bool mark)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  commitPreedit(this);
  iVar4 = pos;
  if ((*(int *)(this + 0x40) != pos) &&
     (this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 2), *(long *)(this + 0xe8) != 0)) {
    if (*(int *)(this + 0x40) < pos) {
      iVar4 = nextMaskBlank(this,pos);
    }
    else {
      iVar4 = findInMask(this,pos,false,false,(QChar)0x0);
      *(ushort *)(this + 0x50) =
           (*(ushort *)(this + 0x50) & 0xfffd) +
           (ushort)(byte)((byte)((*(ushort *)(this + 0x50) & 2) >> 1) | iVar4 != pos) * 2;
      if (iVar4 == -1) {
        iVar4 = 0;
      }
    }
  }
  iVar5 = *(int *)(this + 0x110);
  iVar1 = *(int *)(this + 0x114);
  if (mark) {
    iVar2 = *(int *)(this + 0x40);
    iVar3 = iVar2;
    if (iVar2 == iVar1) {
      iVar3 = iVar5;
    }
    if (iVar1 <= iVar5) {
      iVar3 = iVar2;
    }
    iVar6 = iVar3;
    if (iVar2 == iVar5) {
      iVar6 = iVar1;
    }
    if (iVar1 <= iVar5) {
      iVar6 = iVar3;
    }
    iVar5 = iVar4;
    if (iVar6 < iVar4) {
      iVar5 = iVar6;
    }
    *(int *)(this + 0x110) = iVar5;
    if (iVar6 <= iVar4) {
      iVar6 = iVar4;
    }
    *(int *)(this + 0x114) = iVar6;
    updateDisplayText(this,false);
  }
  else {
    *(ushort *)(this + 0x50) =
         (ushort)*(undefined4 *)(this + 0x50) & 0xff7f |
         (ushort)((char)*(undefined4 *)(this + 0x50) < '\0' || iVar5 < iVar1) << 7;
    *(undefined8 *)(this + 0x110) = 0;
  }
  *(int *)(this + 0x40) = iVar4;
  if ((mark) || (((byte)this[0x50] & 0x80) != 0)) {
    this[0x50] = (QWidgetLineControl)((byte)this[0x50] & 0x7f);
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)0x0);
  }
  emitCursorPositionChanged(this);
  return;
}

Assistant:

void QWidgetLineControl::moveCursor(int pos, bool mark)
{
    commitPreedit();

    if (pos != m_cursor) {
        separate();
        if (m_maskData)
            pos = pos > m_cursor ? nextMaskBlank(pos) : prevMaskBlank(pos);
    }
    if (mark) {
        int anchor;
        if (m_selend > m_selstart && m_cursor == m_selstart)
            anchor = m_selend;
        else if (m_selend > m_selstart && m_cursor == m_selend)
            anchor = m_selstart;
        else
            anchor = m_cursor;
        m_selstart = qMin(anchor, pos);
        m_selend = qMax(anchor, pos);
        updateDisplayText();
    } else {
        internalDeselect();
    }
    m_cursor = pos;
    if (mark || m_selDirty) {
        m_selDirty = false;
        emit selectionChanged();
    }
    emitCursorPositionChanged();
}